

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection_dispatch.c
# Opt level: O2

int streamWrapper(void *ptr,mpt_message *msg)

{
  uint8_t *puVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  undefined8 *puVar5;
  long lVar6;
  _mpt_vptr_reply_context *p_Var7;
  char *pcVar8;
  mpt_message *pmVar9;
  char *pcVar10;
  ulong uVar11;
  mpt_reply_context *rc;
  mpt_reply_data *rd;
  uint64_t mid;
  mpt_msgtype hdr;
  mpt_event ev;
  mpt_message local_148;
  uint8_t id [255];
  
  ev.id = 0;
  ev.reply = (mpt_reply_context *)0x0;
  lVar6 = *ptr;
  uVar11 = (ulong)*(byte *)(lVar6 + 0xd);
  if (uVar11 == 0) {
    if (*(code **)((long)ptr + 8) != (code *)0x0) {
      ev.msg = msg;
      iVar2 = (**(code **)((long)ptr + 8))(*(undefined8 *)((long)ptr + 0x10),&ev);
      return iVar2;
    }
LAB_00104a76:
    iVar2 = 0;
  }
  else {
    ev.msg = &local_148;
    local_148.used = msg->used;
    local_148.base = msg->base;
    local_148.cont = msg->cont;
    local_148.clen = msg->clen;
    uVar4 = mpt_message_read(ev.msg,uVar11,id);
    if (uVar4 < uVar11) {
      pcVar8 = "%s: %s";
      pcVar10 = "message id incomplete";
    }
    else {
      if (-1 < (char)id[0]) {
        uVar4 = 0;
        do {
          if (uVar11 == uVar4) goto LAB_001049fc;
          puVar1 = id + uVar4;
          uVar4 = uVar4 + 1;
        } while (*puVar1 == '\0');
        puVar5 = *(undefined8 **)(lVar6 + 0x20);
        if (puVar5 == (undefined8 *)0x0) {
          puVar5 = (undefined8 *)mpt_reply_deferrable(uVar11,replyConnection,lVar6);
          if (puVar5 != (undefined8 *)0x0) {
            *(undefined8 **)(lVar6 + 0x20) = puVar5;
            goto LAB_00104883;
          }
          mpt_message_buf2id(id,uVar11,&mid);
          mpt_log(0,"mpt::connection::dispatch<mpt::stream>",4,"%s: %s (%08lx)",
                  "dispatch incomplete","no context available",mid);
LAB_001049fc:
          rc = (mpt_reply_context *)0x0;
          rd = (mpt_reply_data *)0x0;
LAB_00104a08:
          ev.reply = (mpt_reply_context *)0x0;
        }
        else {
LAB_00104883:
          rc = (mpt_reply_context *)0x0;
          rd = (mpt_reply_data *)0x0;
          iVar2 = (**(code **)*puVar5)(puVar5,8);
          if ((iVar2 < 0) || (rd == (mpt_reply_data *)0x0)) goto LAB_00104a08;
          (**(code **)*puVar5)(puVar5,0x82,&rc);
          ev.reply = rc;
          if ((rc != (mpt_reply_context *)0x0) && (iVar2 = mpt_reply_set(rd,uVar11,id), iVar2 < 0))
          {
            mpt_log(0,"mpt::connection::dispatch<mpt::stream>",3,"%s: %s","dispatch failed",
                    "context not ready");
            return -4;
          }
        }
        if (*(code **)((long)ptr + 8) != (code *)0x0) {
          iVar2 = (**(code **)((long)ptr + 8))(*(undefined8 *)((long)ptr + 0x10),&ev);
          if (rc == (mpt_reply_context *)0x0) {
            return iVar2;
          }
          if (rd->len == 0) {
            return iVar2;
          }
          local_148.base = &hdr;
          hdr.cmd = '\x01';
          hdr.arg = (int8_t)iVar2;
          pmVar9 = &local_148;
          local_148.used = 2;
          local_148.cont = (iovec *)0x0;
          local_148.clen = 0;
          p_Var7 = rc->_vptr;
LAB_00104a72:
          (*p_Var7->reply)(rc,pmVar9);
          return iVar2;
        }
        if (rc != (mpt_reply_context *)0x0) {
          p_Var7 = rc->_vptr;
          iVar2 = 0;
          pmVar9 = (mpt_message *)0x0;
          goto LAB_00104a72;
        }
        goto LAB_00104a76;
      }
      id[0] = id[0] & 0x7f;
      uVar3 = mpt_message_buf2id(id,uVar11,&mid);
      if (8 < uVar3) {
        mpt_log(0,"mpt::connection::dispatch<mpt::stream>",3,"%s: %s","dispatch failed",
                "reply id invalid");
      }
      lVar6 = mpt_command_get(lVar6 + 0x18,mid);
      if (lVar6 != 0) {
        iVar2 = (**(code **)(lVar6 + 8))(*(undefined8 *)(lVar6 + 0x10),&local_148);
        return iVar2;
      }
      pcVar8 = "%s: %s (%08lx)";
      pcVar10 = "unknown reply id";
    }
    mpt_log(0,"mpt::connection::dispatch<mpt::stream>",3,pcVar8,"dispatch failed",pcVar10);
    iVar2 = -2;
  }
  return iVar2;
}

Assistant:

int streamWrapper(void *ptr, const MPT_STRUCT(message) *msg)
{
	const struct _streamWrapper *wd = ptr;
	MPT_STRUCT(reply_data) *rd;
	MPT_STRUCT(reply_context) *rc;
	MPT_STRUCT(connection) *con;
	MPT_STRUCT(event) ev = MPT_EVENT_INIT;
	uint8_t idlen;
	
	con = wd->con;
	
	/* default to one-way processing */
	if (!(idlen = con->out._idlen)) {
		if (!wd->cmd) {
			return 0;
		}
		ev.msg = msg;
		return wd->cmd(wd->arg, &ev);
	}
	else {
		static const char _func[] = "mpt::connection::dispatch<mpt::stream>";
		MPT_STRUCT(message) tmp;
		uint64_t mid;
		uint8_t id[UINT8_MAX], i;
		MPT_STRUCT(metatype) *ctx;
		int ret;
		
		/* consume message ID */
		ev.msg = &tmp;
		tmp = *msg;
		if ((mpt_message_read(&tmp, idlen, id)) < idlen) {
			mpt_log(0, _func, MPT_LOG(Error), "%s: %s",
			        MPT_tr("dispatch failed"), MPT_tr("message id incomplete"));
			return MPT_ERROR(BadValue);
		}
		/* test reply indicator */
		if (id[0] & 0x80) {
			MPT_STRUCT(command) *ans;
			
			id[0] &= 0x7f;
			if ((ret = mpt_message_buf2id(id, idlen, &mid)) < 0
			    || ret > (int) sizeof(ans->id)) {
				mpt_log(0, _func, MPT_LOG(Error), "%s: %s",
				        MPT_tr("dispatch failed"), MPT_tr("reply id invalid"));
			}
			/* find reply handler */
			if (!(ans = mpt_command_get(&con->_wait, mid))) {
				mpt_log(0, _func, MPT_LOG(Error), "%s: %s (%08" PRIx64 ")",
				        MPT_tr("dispatch failed"), MPT_tr("unknown reply id"), mid);
				return MPT_ERROR(BadValue);
			}
			return ans->cmd(ans->arg, &tmp);
		}
		ctx = 0;
		for (i = 0; i < idlen; ++i) {
			/* skip zero elements */
			if (!id[i]) {
				continue;
			}
			/* reply context required */
			if ((ctx = con->_rctx)) {
				break;
			}
			if ((ctx = mpt_reply_deferrable(idlen, replyConnection, con))) {
				con->_rctx = ctx;
				break;
			}
			mpt_message_buf2id(id, idlen, &mid);
			mpt_log(0, _func, MPT_LOG(Warning), "%s: %s (%08" PRIx64 ")",
			        MPT_tr("dispatch incomplete"), MPT_tr("no context available"), mid);
			break;
		}
		/* get reply data and interface for reference */
		rc = 0;
		rd = 0;
		if (ctx
		    && MPT_metatype_convert(ctx, MPT_ENUM(TypeReplyDataPtr), &rd) >= 0
		    && rd) {
			MPT_metatype_convert(ctx, MPT_ENUM(TypeReplyPtr), &rc);
		}
		if ((ev.reply = rc) && mpt_reply_set(rd, idlen, id) < 0) {
			mpt_log(0, _func, MPT_LOG(Error), "%s: %s",
			        MPT_tr("dispatch failed"), MPT_tr("context not ready"));
			return MPT_ERROR(BadOperation);
		}
		if (!wd->cmd) {
			if (rc) {
				rc->_vptr->reply(rc, 0);
			}
			return 0;
		}
		ret = wd->cmd(wd->arg, &ev);
		/* generic reply to failed command */
		if (rc && rd->len) {
			MPT_STRUCT(msgtype) hdr;
			hdr.cmd = MPT_MESGTYPE(Answer);
			hdr.arg = ret;
			tmp.base = &hdr;
			tmp.used = sizeof(hdr);
			tmp.cont = 0;
			tmp.clen = 0;
			rc->_vptr->reply(rc, &tmp);
		}
		return ret;
	}
}